

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O1

void __thiscall
Imf_3_2::Image::insertChannel
          (Image *this,string *name,PixelType type,int xSampling,int ySampling,bool pLinear)

{
  long *plVar1;
  mapped_type *pmVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
           ::operator[](&this->_channels,name);
  pmVar2->type = type;
  pmVar2->xSampling = xSampling;
  pmVar2->ySampling = ySampling;
  pmVar2->pLinear = pLinear;
  if (0 < (this->_levels)._sizeX) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar3 = (this->_levels)._sizeY;
      if (0 < lVar3) {
        lVar6 = 0;
        do {
          plVar1 = *(long **)((long)(this->_levels)._data + lVar6 * 8 + lVar3 * lVar5);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 0x20))(plVar1,name,type,xSampling,ySampling,pLinear);
          }
          lVar6 = lVar6 + 1;
          lVar3 = (this->_levels)._sizeY;
        } while (lVar6 < lVar3);
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (lVar4 < (this->_levels)._sizeX);
  }
  return;
}

Assistant:

void
Image::insertChannel (
    const std::string& name,
    PixelType          type,
    int                xSampling,
    int                ySampling,
    bool               pLinear)
{
    try
    {
        _channels[name] = ChannelInfo (type, xSampling, ySampling, pLinear);

        for (int y = 0; y < _levels.height (); ++y)
            for (int x = 0; x < _levels.width (); ++x)
                if (_levels[y][x])
                    _levels[y][x]->insertChannel (
                        name, type, xSampling, ySampling, pLinear);
    }
    catch (...)
    {
        eraseChannel (name);
        throw;
    }
}